

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlGetDocCompressMode(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_48;
  undefined *local_40;
  PyObject *pyobj_doc;
  xmlDoc *doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlGetDocCompressMode",&local_40);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_40 == &_Py_NoneStruct) {
      local_48 = (PyObject *)0x0;
    }
    else {
      local_48 = *(PyObject **)(local_40 + 0x10);
    }
    pyobj_doc = local_48;
    doc._4_4_ = xmlGetDocCompressMode(local_48);
    self_local = libxml_intWrap(doc._4_4_);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlGetDocCompressMode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlDoc * doc;
    PyObject *pyobj_doc;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlGetDocCompressMode", &pyobj_doc))
        return(NULL);
    doc = (xmlDoc *) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlGetDocCompressMode(doc);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}